

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

HelicsFilter helicsCoreRegisterCloningFilter(HelicsCore core,char *name,HelicsError *err)

{
  Filter *pFVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Head_base<0UL,_helics::Filter_*,_false> _Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_t sVar5;
  HelicsFilter pvVar6;
  char *in_R9;
  string_view delivery;
  string_view name_00;
  FilterObject *local_b0;
  _Head_base<0UL,_helics::FilterObject_*,_false> local_a8;
  _Head_base<0UL,_helics::Filter_*,_false> local_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  long *local_80;
  undefined8 local_78;
  long local_70 [2];
  undefined8 local_60;
  long *plStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  getCoreSharedPtr(&local_98,(HelicsError *)core);
  peVar3 = local_98;
  if (local_98 == (element_type *)0x0) {
    pvVar6 = (HelicsFilter)0x0;
  }
  else {
    local_b0 = (FilterObject *)operator_new(0x58);
    (local_b0->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_b0->buffer)._M_dataplus._M_p = (pointer)0x0;
    (local_b0->buffer)._M_string_length = 0;
    (local_b0->buffer).field_2._M_allocated_capacity = 0;
    (local_b0->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_b0->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_b0->uFilter)._M_t.
    super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
    (local_b0->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b0->cloning = false;
    local_b0->custom = false;
    *(undefined2 *)&local_b0->field_0x2 = 0;
    local_b0->valid = 0;
    local_b0->filtPtr = (Filter *)0x0;
    *(undefined8 *)((long)&(local_b0->buffer).field_2 + 8) = 0;
    (local_b0->buffer)._M_dataplus._M_p = (pointer)&(local_b0->buffer).field_2;
    local_48 = 0;
    local_40 = 0;
    local_80 = local_70;
    local_50 = &local_40;
    if (name == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar5 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,name,name + sVar5);
    }
    local_60 = local_78;
    plStack_58 = local_80;
    delivery._M_str = (char *)0x0;
    delivery._M_len = (size_t)peVar3;
    name_00._M_str = in_R9;
    name_00._M_len = (size_t)&local_40;
    helics::make_cloning_filter((FilterTypes)&local_a0,(Core *)0x5,delivery,name_00);
    _Var2._M_head_impl = local_a0._M_head_impl;
    local_a0._M_head_impl = (Filter *)0x0;
    pFVar1 = (local_b0->uFilter)._M_t.
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
    (local_b0->uFilter)._M_t.
    super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (pFVar1 != (Filter *)0x0) {
      (**(code **)((long)(pFVar1->super_Interface)._vptr_Interface + 8))();
      if (local_a0._M_head_impl != (Filter *)0x0) {
        (*((local_a0._M_head_impl)->super_Interface)._vptr_Interface[1])();
      }
    }
    local_a0._M_head_impl = (Filter *)0x0;
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    p_Var4 = p_Stack_90;
    peVar3 = local_98;
    local_b0->filtPtr =
         (local_b0->uFilter)._M_t.
         super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
         super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
    local_98 = (element_type *)0x0;
    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_b0->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (local_b0->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3
    ;
    (local_b0->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    local_a8._M_head_impl = local_b0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      local_a8._M_head_impl = local_b0;
    }
    (local_a8._M_head_impl)->cloning = true;
    local_b0 = (FilterObject *)0x0;
    pvVar6 = anon_unknown.dwarf_ba607::coreAddFilter
                       (core,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                              *)&local_a8);
    if (local_a8._M_head_impl != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_a8,local_a8._M_head_impl);
    }
    local_a8._M_head_impl = (FilterObject *)0x0;
    if (local_b0 != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_b0,local_b0);
    }
  }
  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
  }
  return pvVar6;
}

Assistant:

HelicsFilter helicsCoreRegisterCloningFilter(HelicsCore core, const char* name, HelicsError* err)
{
    auto corePtr = getCoreSharedPtr(core, err);
    if (!corePtr) {
        return nullptr;
    }
    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->uFilter = helics::make_cloning_filter(helics::FilterTypes::CLONE, corePtr.get(), std::string{}, AS_STRING(name));
        filt->filtPtr = filt->uFilter.get();
        filt->corePtr = std::move(corePtr);
        filt->cloning = true;
        return coreAddFilter(core, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}